

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImgDisplay * __thiscall
cimg_library::CImgDisplay::display<unsigned_char>(CImgDisplay *this,CImg<unsigned_char> *img)

{
  CImgDisplay *pCVar1;
  CImgArgumentException *this_00;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  
  if (img->_data == (uchar *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    bVar5 = this->_title != (char *)0x0;
    uVar2 = 0x5b;
    if (bVar5) {
      uVar2 = 0x22;
    }
    pcVar3 = "untitled";
    if (bVar5) {
      pcVar3 = this->_title;
    }
    uVar4 = 0x5d;
    if (bVar5) {
      uVar4 = 0x22;
    }
    CImgArgumentException::CImgArgumentException
              (this_00,"[instance(%u,%u,%u,%c%s%c)] CImgDisplay::display(): Empty specified image.",
               (ulong)this->_width,(ulong)this->_height,(ulong)this->_normalization,uVar2,pcVar3,
               uVar4);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  if ((this->_width != 0) && (this->_height != 0)) {
    pCVar1 = render<unsigned_char>(this,img,false);
    pCVar1 = paint(pCVar1,false);
    return pCVar1;
  }
  pCVar1 = assign<unsigned_char>(this,img,(char *)0x0,3,false,false);
  return pCVar1;
}

Assistant:

CImgDisplay& display(const CImg<T>& img) {
      if (!img)
        throw CImgArgumentException(_cimgdisplay_instance
                                    "display(): Empty specified image.",
                                    cimgdisplay_instance);
      if (is_empty()) return assign(img);
      return render(img).paint(false);
    }